

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O3

Name wasm::Names::getValidGlobalName(Module *module,Name root)

{
  pointer puVar1;
  pointer puVar2;
  string *in_R9;
  Name root_00;
  IString IVar3;
  long *local_70 [2];
  long local_60 [2];
  Module *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_48 = 0;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:79:5)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:79:5)>
             ::_M_manager;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70[0] = local_60;
  local_50 = module;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"_","");
  root_00.super_IString.str._M_str = (char *)&local_50;
  root_00.super_IString.str._M_len = (size_t)root.super_IString.str._M_str;
  IVar3.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)
                           ((ulong)((long)puVar2 - (long)puVar1) >> 3 & 0xffffffff),(Index)local_70,
                           in_R9);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return (IString)(IString)IVar3.str;
}

Assistant:

inline Name getValidGlobalName(Module& module, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !module.getGlobalOrNull(test); },
    module.globals.size());
}